

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MathFuncs.cpp
# Opt level: O0

void __thiscall
slang::ast::builtins::RealMath1Function<&floor>::~RealMath1Function(RealMath1Function<&floor> *this)

{
  void *in_RDI;
  size_t in_stack_ffffffffffffffe8;
  
  ~RealMath1Function((RealMath1Function<&floor> *)0x96ce78);
  operator_delete(in_RDI,in_stack_ffffffffffffffe8);
  return;
}

Assistant:

RealMath1Function(const Builtins& builtins, KnownSystemName knownNameId) :
        SimpleSystemSubroutine(knownNameId, SubroutineKind::Function, 1, {&builtins.realType},
                               builtins.realType, false) {}